

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strcpy_s( s, 6, "" ) == 0 );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strcpy_s( s, 6, abcde ) == 0 );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );

    /* Overrun. */
    TESTCASE( strcpy_s( s, 6, "abcdef" ) != 0 );

    /* Overlapping. */
    TESTCASE( strcpy_s( s, 3, s + 2 ) != 0 );
    TESTCASE( strcpy_s( s + 2, 3, s ) != 0 );

    TESTCASE( HANDLER_CALLS == 3 );
#endif
    return TEST_RESULTS;
}